

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeColumns(ImGuiOldColumns *columns)

{
  float fVar1;
  bool bVar2;
  ImGuiOldColumnData *pIVar3;
  ImGuiOldColumns *in_RDI;
  float fVar4;
  int column_n;
  ImGuiOldColumns *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar5;
  uint local_c;
  
  bVar2 = TreeNode((void *)(ulong)in_RDI->ID,"Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                   (ulong)in_RDI->ID,(ulong)(uint)in_RDI->Count,(ulong)(uint)in_RDI->Flags);
  if (bVar2) {
    BulletText((char *)(double)(in_RDI->OffMaxX - in_RDI->OffMinX),(double)in_RDI->OffMinX,
               (double)in_RDI->OffMaxX,"Width: %.1f (MinX: %.1f, MaxX: %.1f)");
    for (local_c = 0; (int)local_c < (in_RDI->Columns).Size; local_c = local_c + 1) {
      uVar5 = local_c;
      pIVar3 = ImVector<ImGuiOldColumnData>::operator[]
                         ((ImVector<ImGuiOldColumnData> *)
                          CONCAT44(local_c,in_stack_ffffffffffffffe0),
                          (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      fVar1 = pIVar3->OffsetNorm;
      in_stack_ffffffffffffffd8 = in_RDI;
      pIVar3 = ImVector<ImGuiOldColumnData>::operator[]
                         ((ImVector<ImGuiOldColumnData> *)CONCAT44(uVar5,in_stack_ffffffffffffffe0),
                          (int)((ulong)in_RDI >> 0x20));
      fVar4 = GetColumnOffsetFromNorm(in_stack_ffffffffffffffd8,pIVar3->OffsetNorm);
      BulletText((char *)(double)fVar1,(double)fVar4,"Column %02d: OffsetNorm %.3f (= %.1f px)",
                 (ulong)uVar5);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeColumns(ImGuiOldColumns* columns)
{
    if (!TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
        return;
    BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
    for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
        BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, GetColumnOffsetFromNorm(columns, columns->Columns[column_n].OffsetNorm));
    TreePop();
}